

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_operators.hpp
# Opt level: O2

ParquetUUIDTargetType __thiscall
duckdb::ParquetUUIDOperator::Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
          (ParquetUUIDOperator *this,hugeint_t input)

{
  data_t *pdVar1;
  unsigned_long shift_count;
  long lVar2;
  ParquetUUIDTargetType result;
  
  pdVar1 = result.bytes;
  for (lVar2 = 0x38; lVar2 != -8; lVar2 = lVar2 + -8) {
    *pdVar1 = (char)((input.lower ^ 0x8000000000000000) >> ((byte)lVar2 & 0x3f));
    pdVar1 = pdVar1 + 1;
  }
  pdVar1 = result.bytes + 8;
  for (lVar2 = 0x38; lVar2 != -8; lVar2 = lVar2 + -8) {
    *pdVar1 = (data_t)((ulong)this >> ((byte)lVar2 & 0x3f));
    pdVar1 = pdVar1 + 1;
  }
  return (ParquetUUIDTargetType)result.bytes;
}

Assistant:

static TGT Operation(SRC input) {
		TGT result;
		uint64_t high_bytes = input.upper ^ (int64_t(1) << 63);
		uint64_t low_bytes = input.lower;
		for (idx_t i = 0; i < sizeof(uint64_t); i++) {
			auto shift_count = (sizeof(uint64_t) - i - 1) * 8;
			result.bytes[i] = (high_bytes >> shift_count) & 0xFF;
		}
		for (idx_t i = 0; i < sizeof(uint64_t); i++) {
			auto shift_count = (sizeof(uint64_t) - i - 1) * 8;
			result.bytes[sizeof(uint64_t) + i] = (low_bytes >> shift_count) & 0xFF;
		}
		return result;
	}